

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

double Cudd_AverageDistance(DdManager *dd)

{
  uint uVar1;
  DdManager *pDVar2;
  DdNode *pDVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  DdNode *pDVar9;
  DdNode *sentinel;
  ulong uVar10;
  DdManager *pDVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar1 = dd->size;
  if (uVar1 != 0) {
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    dVar14 = 0.0;
    dVar15 = 0.0;
    dVar16 = 0.0;
    dVar13 = 0.0;
    for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      uVar1 = dd->subtables[uVar5].slots;
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar8 = 0;
      }
      dVar18 = 0.0;
      dVar17 = 0.0;
      for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        pDVar2 = (DdManager *)dd->subtables[uVar5].nodelist[uVar10];
        while (pDVar11 = pDVar2, pDVar11 != dd) {
          lVar12 = (long)pDVar11 - (long)(pDVar11->sentinel).type.kids.T;
          lVar7 = -lVar12;
          if (0 < lVar12) {
            lVar7 = lVar12;
          }
          lVar6 = (long)pDVar11 - ((ulong)(pDVar11->sentinel).type.kids.E & 0xfffffffffffffffe);
          lVar12 = -lVar6;
          if (0 < lVar6) {
            lVar12 = lVar6;
          }
          pDVar2 = (DdManager *)(pDVar11->sentinel).next;
          dVar18 = (double)lVar12 + dVar18 + (double)lVar7;
          dVar15 = dVar15 + 2.0;
          if (pDVar2 != dd) {
            lVar12 = (long)pDVar11 - (long)pDVar2;
            lVar7 = -lVar12;
            if (0 < lVar12) {
              lVar7 = lVar12;
            }
            dVar17 = dVar17 + (double)lVar7;
            dVar16 = dVar16 + 1.0;
          }
        }
      }
      dVar13 = dVar13 + dVar18;
      dVar14 = dVar14 + dVar17;
    }
    uVar1 = (dd->constants).slots;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    dVar17 = 0.0;
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      pDVar3 = (dd->constants).nodelist[uVar5];
      while (pDVar9 = pDVar3, pDVar9 != (DdNode *)0x0) {
        pDVar3 = pDVar9->next;
        if (pDVar3 != (DdNode *)0x0) {
          lVar12 = (long)pDVar9 - (long)pDVar3;
          lVar7 = -lVar12;
          if (0 < lVar12) {
            lVar7 = lVar12;
          }
          dVar17 = dVar17 + (double)lVar7;
          dVar16 = dVar16 + 1.0;
        }
      }
    }
    return (dVar13 + dVar14 + dVar17) / (dVar15 + dVar16);
  }
  return 0.0;
}

Assistant:

double
Cudd_AverageDistance(
  DdManager * dd)
{
    double tetotal, nexttotal;
    double tesubtotal, nextsubtotal;
    double temeasured, nextmeasured;
    int i, j;
    int slots, nvars;
    long diff;
    DdNode *scan;
    DdNodePtr *nodelist;
    DdNode *sentinel = &(dd->sentinel);

    nvars = dd->size;
    if (nvars == 0) return(0.0);

    /* Initialize totals. */
    tetotal = 0.0;
    nexttotal = 0.0;
    temeasured = 0.0;
    nextmeasured = 0.0;

    /* Scan the variable subtables. */
    for (i = 0; i < nvars; i++) {
        nodelist = dd->subtables[i].nodelist;
        tesubtotal = 0.0;
        nextsubtotal = 0.0;
        slots = dd->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            scan = nodelist[j];
            while (scan != sentinel) {
                diff = (long) scan - (long) cuddT(scan);
                tesubtotal += (double) ddAbs(diff);
                diff = (long) scan - (long) Cudd_Regular(cuddE(scan));
                tesubtotal += (double) ddAbs(diff);
                temeasured += 2.0;
                if (scan->next != sentinel) {
                    diff = (long) scan - (long) scan->next;
                    nextsubtotal += (double) ddAbs(diff);
                    nextmeasured += 1.0;
                }
                scan = scan->next;
            }
        }
        tetotal += tesubtotal;
        nexttotal += nextsubtotal;
    }

    /* Scan the constant table. */
    nodelist = dd->constants.nodelist;
    nextsubtotal = 0.0;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if (scan->next != NULL) {
                diff = (long) scan - (long) scan->next;
                nextsubtotal += (double) ddAbs(diff);
                nextmeasured += 1.0;
            }
            scan = scan->next;
        }
    }
    nexttotal += nextsubtotal;

    return((tetotal + nexttotal) / (temeasured + nextmeasured));

}